

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void deleteMissingFiles(Options *options,QDir *srcDir,QDir *dstDir)

{
  long lVar1;
  int *piVar2;
  FILE *pFVar3;
  char cVar4;
  storage_type *psVar5;
  QDir *this;
  undefined8 *puVar6;
  long lVar7;
  QFileInfo *dst;
  long lVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  QArrayData *local_d8;
  longlong local_d0;
  QArrayData *local_c0;
  undefined8 *local_b8;
  QArrayData *local_a8;
  storage_type *local_a0;
  long local_98;
  QArrayData *local_90;
  storage_type *local_88;
  long local_80;
  QArrayDataPointer<QFileInfo> local_78;
  QArrayDataPointer<QFileInfo> local_58;
  long local_38;
  
  pFVar3 = _stdout;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (options->verbose == true) {
    QDir::absolutePath();
    QString::toLocal8Bit_helper((QChar *)&local_58,CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_));
    puVar6 = (undefined8 *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    if (puVar6 == (undefined8 *)0x0) {
      puVar6 = &QByteArray::_empty;
    }
    QDir::absolutePath();
    QString::toLocal8Bit_helper((QChar *)&local_90,(longlong)local_a0);
    psVar5 = local_88;
    if (local_88 == (storage_type *)0x0) {
      psVar5 = (storage_type *)&QByteArray::_empty;
    }
    fprintf(pFVar3,"Delete missing files %s %s\n",puVar6,psVar5);
    if (local_90 != (QArrayData *)0x0) {
      LOCK();
      (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_90,1,0x10);
      }
    }
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_),1,0x10);
      }
    }
    piVar2 = (int *)CONCAT44(local_78.d._4_4_,local_78.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d._4_4_,local_78.d._0_4_),2,0x10);
      }
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  QDir::entryInfoList(&local_58,srcDir,0x6003,0xffffffff);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d._0_4_ = 0xaaaaaaaa;
  local_78.d._4_4_ = 0xaaaaaaaa;
  local_78.ptr._0_4_ = 0xaaaaaaaa;
  local_78.ptr._4_4_ = 0xaaaaaaaa;
  QDir::entryInfoList(&local_78,dstDir,0x6003,0xffffffff);
  if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
    lVar8 = CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
    lVar1 = lVar8 + local_78.size * 8;
    do {
      if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
        lVar7 = local_58.size << 3;
        do {
          QFileInfo::fileName();
          QFileInfo::fileName();
          if (local_80 == local_98) {
            QVar9.m_data = local_88;
            QVar9.m_size = local_80;
            QVar10.m_data = local_a0;
            QVar10.m_size = local_80;
            cVar4 = QtPrivate::equalStrings(QVar9,QVar10);
          }
          else {
            cVar4 = '\0';
          }
          if (local_a8 != (QArrayData *)0x0) {
            LOCK();
            (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_a8,2,0x10);
            }
          }
          if (local_90 != (QArrayData *)0x0) {
            LOCK();
            (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_90,2,0x10);
            }
          }
          if (cVar4 != '\0') {
            cVar4 = QFileInfo::isDir();
            if (cVar4 == '\0') goto LAB_0010d077;
            QFileInfo::absoluteFilePath();
            QDir::QDir((QDir *)&local_c0,(QString *)&local_90);
            QFileInfo::absoluteFilePath();
            QDir::QDir((QDir *)&local_d8,(QString *)&local_a8);
            deleteMissingFiles(options,(QDir *)&local_c0,(QDir *)&local_d8);
            QDir::~QDir((QDir *)&local_d8);
            if (local_a8 != (QArrayData *)0x0) {
              LOCK();
              (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_a8,2,0x10);
              }
            }
            this = (QDir *)&local_c0;
            goto LAB_0010d04f;
          }
          lVar7 = lVar7 + -8;
        } while (lVar7 != 0);
      }
      pFVar3 = _stdout;
      if (options->verbose == true) {
        QFileInfo::fileName();
        QString::toLocal8Bit_helper((QChar *)&local_90,(longlong)local_a0);
        psVar5 = local_88;
        if (local_88 == (storage_type *)0x0) {
          psVar5 = (storage_type *)&QByteArray::_empty;
        }
        QDir::absolutePath();
        QString::toLocal8Bit_helper((QChar *)&local_c0,local_d0);
        puVar6 = local_b8;
        if (local_b8 == (undefined8 *)0x0) {
          puVar6 = &QByteArray::_empty;
        }
        fprintf(pFVar3,"%s not found in %s, removing it.\n",psVar5,puVar6);
        if (local_c0 != (QArrayData *)0x0) {
          LOCK();
          (local_c0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_c0,1,0x10);
          }
        }
        if (local_d8 != (QArrayData *)0x0) {
          LOCK();
          (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_d8,2,0x10);
          }
        }
        if (local_90 != (QArrayData *)0x0) {
          LOCK();
          (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_90,1,0x10);
          }
        }
        if (local_a8 != (QArrayData *)0x0) {
          LOCK();
          (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a8,2,0x10);
          }
        }
      }
      cVar4 = QFileInfo::isDir();
      if (cVar4 == '\0') {
        QFileInfo::absoluteFilePath();
        QFile::remove((QString *)&local_90);
      }
      else {
        QFileInfo::absolutePath();
        QDir::QDir((QDir *)&local_a8,(QString *)&local_90);
        QDir::removeRecursively();
        this = (QDir *)&local_a8;
LAB_0010d04f:
        QDir::~QDir(this);
      }
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_90,2,0x10);
        }
      }
LAB_0010d077:
      lVar8 = lVar8 + 8;
    } while (lVar8 != lVar1);
  }
  fflush(_stdout);
  QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void deleteMissingFiles(const Options &options, const QDir &srcDir, const QDir &dstDir)
{
    if (options.verbose)
        fprintf(stdout, "Delete missing files %s %s\n", qPrintable(srcDir.absolutePath()), qPrintable(dstDir.absolutePath()));

    const QFileInfoList srcEntries = srcDir.entryInfoList(QDir::NoDotAndDotDot | QDir::Files | QDir::Dirs);
    const QFileInfoList dstEntries = dstDir.entryInfoList(QDir::NoDotAndDotDot | QDir::Files | QDir::Dirs);
    for (const QFileInfo &dst : dstEntries) {
        bool found = false;
        for (const QFileInfo &src : srcEntries)
            if (dst.fileName() == src.fileName()) {
                if (dst.isDir())
                    deleteMissingFiles(options, src.absoluteFilePath(), dst.absoluteFilePath());
                found = true;
                break;
            }

        if (!found) {
            if (options.verbose)
                fprintf(stdout, "%s not found in %s, removing it.\n", qPrintable(dst.fileName()), qPrintable(srcDir.absolutePath()));

            if (dst.isDir())
                QDir{dst.absolutePath()}.removeRecursively();
            else
                QFile::remove(dst.absoluteFilePath());
        }
    }
    fflush(stdout);
}